

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_hash_table.hpp
# Opt level: O0

uint64_t __thiscall
poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::get
          (standard_hash_table<80U,_poplar::hash::vigna_hasher> *this,uint64_t key)

{
  bool bVar1;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> *psVar2;
  const_reference pvVar3;
  uint64_t in_RSI;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> *in_RDI;
  uint64_t i;
  
  psVar2 = in_RDI;
  bVar1 = std::
          vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
          ::empty(&in_RDI->table_);
  if (!bVar1) {
    psVar2 = (standard_hash_table<80U,_poplar::hash::vigna_hasher> *)init_id_(psVar2,in_RSI);
    while (pvVar3 = std::
                    vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
                    ::operator[](&in_RDI->table_,(size_type)psVar2),
          pvVar3->key != 0xffffffffffffffff) {
      pvVar3 = std::
               vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
               ::operator[](&in_RDI->table_,(size_type)psVar2);
      if (pvVar3->key == in_RSI) {
        pvVar3 = std::
                 vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
                 ::operator[](&in_RDI->table_,(size_type)psVar2);
        return pvVar3->val;
      }
      psVar2 = (standard_hash_table<80U,_poplar::hash::vigna_hasher> *)
               right_(psVar2,(uint64_t)in_RDI);
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

uint64_t get(uint64_t key) const {
        if (table_.empty()) {
            return nil;
        }

        for (uint64_t i = init_id_(key);; i = right_(i)) {
            if (table_[i].key == UINT64_MAX) {
                return nil;
            }
            if (table_[i].key == key) {
                return table_[i].val;
            }
        }
    }